

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat.cpp
# Opt level: O3

uint64_t EncodeDouble(double f)

{
  ulong uVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  double dVar3;
  int exp;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((f != 0.0) || (NAN(f))) {
    if (NAN(f)) {
      uVar2 = 0x7ff8000000000000;
    }
    else {
      dVar3 = (double)((ulong)f & 0x8000000000000000 | (ulong)DAT_0112cb10);
      if (ABS(f) == INFINITY) {
        uVar2 = (-(ulong)(dVar3 != -1.0) << 0x3f) + 0xfff0000000000000;
      }
      else {
        if ((dVar3 == -1.0) && (!NAN(dVar3))) {
          f = -f;
        }
        uVar2 = -(ulong)(dVar3 == -1.0) << 0x3f;
        dVar3 = frexp(f,(int *)&local_24);
        dVar3 = round(dVar3 * 9007199254740992.0);
        uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
        if ((int)local_24 < -0x3fd) {
          if (local_24 < 0xfffffbc4) goto LAB_00dd015f;
          uVar1 = uVar1 >> (3U - (char)local_24 & 0x3f);
        }
        else {
          if (0x400 < (int)local_24) {
            uVar2 = uVar2 | 0x7ff0000000000000;
            goto LAB_00dd015f;
          }
          uVar1 = uVar1 & 0xfffffffffffff | (ulong)(local_24 + 0x3fe) << 0x34;
        }
        uVar2 = uVar2 | uVar1;
      }
    }
  }
  else {
    uVar2 = -(ulong)((double)((ulong)f & 0x8000000000000000 | (ulong)DAT_0112cb10) == -1.0) << 0x3f;
  }
LAB_00dd015f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t EncodeDouble(double f) noexcept {
    int cls = std::fpclassify(f);
    uint64_t sign = 0;
    if (copysign(1.0, f) == -1.0) {
        f = -f;
        sign = 0x8000000000000000;
    }
    // Zero
    if (cls == FP_ZERO) return sign;
    // Infinity
    if (cls == FP_INFINITE) return sign | 0x7ff0000000000000;
    // NaN
    if (cls == FP_NAN) return 0x7ff8000000000000;
    // Other numbers
    int exp;
    uint64_t man = std::round(std::frexp(f, &exp) * 9007199254740992.0);
    if (exp < -1021) {
        // Too small to represent, encode 0
        if (exp < -1084) return sign;
        // Subnormal numbers
        return sign | (man >> (-1021 - exp));
    } else {
        // Too big to represent, encode infinity
        if (exp > 1024) return sign | 0x7ff0000000000000;
        // Normal numbers
        return sign | (((uint64_t)(1022 + exp)) << 52) | (man & 0xFFFFFFFFFFFFF);
    }
}